

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

token_t * get_token(void)

{
  int iVar1;
  ushort **ppuVar2;
  token_t *ptVar3;
  int len;
  char *p;
  int skip;
  int local_1c;
  char *local_18;
  int local_c;
  token_t *local_8;
  
  local_c = 0x31;
  readbyte();
  do {
    while( true ) {
      while( true ) {
        if (local_c == 0) {
          eline = line;
          ecolumn = column;
          t.id = c;
          t.line = line;
          t.column = column;
          if (((c == 0x23) && (prev == 10)) &&
             (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[l] & 0x2000) != 0)) {
            parse_pp_info();
            local_8 = get_token();
          }
          else {
            if (c != -1) {
              ppuVar2 = __ctype_b_loc();
              if ((((*ppuVar2)[c] & 0x400) == 0) && (c != 0x5f)) {
                ppuVar2 = __ctype_b_loc();
                if (((*ppuVar2)[c] & 0x800) == 0) {
                  if (c == 0x3e) {
                    if (l == 0x3d) {
                      readbyte();
                      t.id = 0x8b;
                    }
                  }
                  else if (c == 0x3c) {
                    if (l == 0x3d) {
                      readbyte();
                      t.id = 0x8a;
                    }
                  }
                  else if (c == 0x21) {
                    if (l == 0x3d) {
                      readbyte();
                      t.id = 0x89;
                    }
                  }
                  else if (c == 0x3d) {
                    if (l == 0x3d) {
                      readbyte();
                      t.id = 0x88;
                    }
                  }
                  else if (((((c != 0x2d) && (c != 0x2b)) &&
                            ((c != 0x2a &&
                             ((((c != 0x2f && (c != 0x25)) && (c != 0x28)) &&
                              ((c != 0x29 && (c != 0x7b)))))))) && (c != 0x7d)) &&
                          (((c != 0x5b && (c != 0x5d)) && ((c != 0x3b && (c != 0x2c)))))) {
                    if ((c < 0x20) || (0x7e < c)) {
                      err(E,"stray \'%o\' in program",(ulong)(uint)c);
                    }
                    else {
                      err(E,"stray \"%c\" in program",(ulong)(uint)c);
                    }
                    ptVar3 = get_token();
                    return ptVar3;
                  }
                }
                else {
                  t.id = 0x87;
                  t._unsigned = 0;
                  t._word = 0;
                  parse_num();
                }
              }
              else {
                local_1c = 1;
                t.id = 0x86;
                t.string[0] = (char)c;
                local_18 = t.string + 1;
                while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[l] & 8) != 0 || l == 0x5f) {
                  readbyte();
                  if (local_1c < 0x1f) {
                    *local_18 = (char)c;
                    local_1c = local_1c + 1;
                    local_18 = local_18 + 1;
                  }
                }
                *local_18 = '\0';
                if (0x1e < local_1c) {
                  err(W,"too long identifier has been truncated to %d characters.",0x1f);
                }
                iVar1 = strcmp(t.string,"byte");
                if (iVar1 == 0) {
                  t.id = 0x80;
                }
                else {
                  iVar1 = strcmp(t.string,"return");
                  if (iVar1 == 0) {
                    t.id = 0x83;
                  }
                  else {
                    iVar1 = strcmp(t.string,"void");
                    if (iVar1 == 0) {
                      t.id = 0x84;
                    }
                    else {
                      iVar1 = strcmp(t.string,"word");
                      if (iVar1 == 0) {
                        t.id = 0x85;
                      }
                    }
                  }
                }
              }
            }
            local_8 = &t;
          }
          return local_8;
        }
        while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[c] & 0x2000) != 0) {
          readbyte();
        }
        if ((c == 0x2f) && ((l == 0x2a || (l == 0x2f)))) break;
        local_c = 0;
      }
      eline = line;
      ecolumn = column;
      readbyte();
      if (c == 0x2a) break;
      do {
        readbyte();
      } while (c != 10);
    }
    do {
      readbyte();
      if (c == -1) {
        err(E,"unterminated comment");
        break;
      }
    } while (c != 0x2a || l != 0x2f);
    readbyte();
    readbyte();
  } while( true );
}

Assistant:

token_t* get_token()
{
    int skip = '1';

    readbyte();

    while (skip)
    {
        while (isspace(c))
            readbyte();

        if (c == '/' && (l == '*' || l == '/'))
        {
            eline = line;
            ecolumn = column;

            readbyte();
            if (c == '*')
            {
                do
                {
                    readbyte();
                    if (c == EOF)
                    {
                        err(E, "unterminated comment");
                        break;
                    }
                } while (!(c == '*' && l == '/'));
                readbyte();
                readbyte();
            }
            else
            {
                do
                {
                    readbyte();
                } while (c != '\n');
            }
        }
        else
            skip = 0;
    }

    eline = line;
    ecolumn = column;

    t.id = c;
    t.line = line;
    t.column = column;

    if (c == '#' && prev == '\n' && isspace(l))
    {
        parse_pp_info();
        return get_token();
    }

    if (c == EOF)
    {
    }
    else if (isalpha(c) || c == '_')
    {
        char* p = t.string;
        int len = 1;
        t.id = IDENTIFIER;

        *p++ = c;
        while (isalnum(l) || l == '_')
        {
            readbyte();
            if (len < MAX_ID_LEN)
            {
                *p++ = c;
                ++len;
            }
        }
        *p = 0;

        if (len >= MAX_ID_LEN)
        {
            err(W, "too long identifier has been truncated to %d characters.",
                 MAX_ID_LEN);
        }

        if (strcmp(t.string, "byte") == 0)
            t.id = BYTE;
        else if (strcmp(t.string, "return") == 0)
            t.id = RETURN;
        else if (strcmp(t.string, "void") == 0)
            t.id = VOID;
        else if (strcmp(t.string, "word") == 0)
            t.id = WORD;
    }
    else if (isdigit(c))
    {
        t.id = CONSTANT;
        t._unsigned = 0;
        t._word = 0;
        parse_num();
    }
    else if ( c == '>')
    {
        if (l == '=')
        {
            readbyte();
            t.id = GE_OP;
        }
    }
    else if (c == '<')
    {
        if (l == '=')
        {
            readbyte();
            t.id = LE_OP;
        }
    }
    else if (c == '!')
    {
        if (l == '=')
        {
            readbyte();
            t.id = NE_OP;
        }
    }
    else if (c == '=')
    {
        if (l == '=')
        {
            readbyte();
            t.id = EQ_OP;
        }
    }
    else if (c == '-')
    {
    }
    else if (c == '+')
    {
    }
    else if (c == '*')
    {
    }
    else if (c == '/')
    {
    }
    else if (c == '%')
    {
    }
    else if (   c == '(' || c == ')'
             || c == '{' || c == '}'
             || c == '[' || c == ']'
             || c == ';' || c == ',')
    {
    }
    else
    {
        if (c < ' ' || c >= 127)
            err(E, "stray '%o' in program", c);
        else
            err(E, "stray \"%c\" in program", c);
        return get_token();
    }

    return &t;
}